

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O1

void llama_batch_free(llama_batch batch)

{
  void *__ptr;
  float *pfVar1;
  void *in_stack_00000010;
  void *in_stack_00000018;
  
  if (in_stack_00000010 != (void *)0x0) {
    free(in_stack_00000010);
  }
  if (in_stack_00000018 != (void *)0x0) {
    free(in_stack_00000018);
  }
  if (batch._0_8_ != 0) {
    free((void *)batch._0_8_);
  }
  if (batch.token != (llama_token *)0x0) {
    free(batch.token);
  }
  if (batch.embd != (float *)0x0) {
    __ptr = *(void **)batch.embd;
    pfVar1 = batch.embd;
    while (__ptr != (void *)0x0) {
      pfVar1 = pfVar1 + 2;
      free(__ptr);
      __ptr = *(void **)pfVar1;
    }
    free(batch.embd);
  }
  if (batch.pos != (llama_pos *)0x0) {
    free(batch.pos);
    return;
  }
  return;
}

Assistant:

void llama_batch_free(struct llama_batch batch) {
    if (batch.token)    free(batch.token);
    if (batch.embd)     free(batch.embd);
    if (batch.pos)      free(batch.pos);
    if (batch.n_seq_id) free(batch.n_seq_id);
    if (batch.seq_id) {
        for (int i = 0; batch.seq_id[i] != nullptr; ++i) {
            free(batch.seq_id[i]);
        }
        free(batch.seq_id);
    }
    if (batch.logits)   free(batch.logits);
}